

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

size_t ZSTD_compressSubBlock_multi
                 (seqStore_t *seqStorePtr,ZSTD_compressedBlockState_t *prevCBlock,
                 ZSTD_compressedBlockState_t *nextCBlock,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,ZSTD_CCtx_params *cctxParams,
                 void *dst,size_t dstCapacity,void *src,size_t srcSize,int bmi2,U32 lastBlock,
                 void *workspace,size_t wkspSize)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t code;
  ZSTD_sequenceLength ZVar4;
  repcodes_t rVar5;
  bool local_181;
  undefined8 local_180;
  U32 local_178;
  U32 local_170;
  undefined8 local_15c;
  repcodes_t rep;
  seqDef *seq;
  size_t err_code_1;
  size_t cSize_1;
  size_t err_code;
  size_t cSize;
  size_t decompressedSize;
  int seqEntropyWritten;
  int litEntropyWritten;
  seqDef *local_110;
  seqDef *sequence;
  size_t cBlockSizeEstimate;
  int local_f8;
  int lastSequence;
  int writeSeqEntropy;
  int writeLitEntropy;
  size_t seqCount;
  size_t litSize;
  size_t targetCBlockSize;
  BYTE *ofCodePtr;
  BYTE *mlCodePtr;
  BYTE *llCodePtr;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  BYTE *lp;
  BYTE *lend;
  BYTE *lstart;
  seqDef *sp;
  seqDef *send;
  seqDef *sstart;
  void *dst_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata_local;
  ZSTD_compressedBlockState_t *nextCBlock_local;
  ZSTD_compressedBlockState_t *prevCBlock_local;
  seqStore_t *seqStorePtr_local;
  
  lstart = (BYTE *)seqStorePtr->sequencesStart;
  sp = seqStorePtr->sequences;
  ip = seqStorePtr->litStart;
  lp = seqStorePtr->lit;
  iend = (BYTE *)src;
  ostart = (BYTE *)((long)src + srcSize);
  op = (BYTE *)((long)dst + dstCapacity);
  mlCodePtr = seqStorePtr->llCode;
  ofCodePtr = seqStorePtr->mlCode;
  targetCBlockSize = (size_t)seqStorePtr->ofCode;
  litSize = cctxParams->targetCBlockSize;
  lastSequence = (int)((entropyMetadata->hufMetadata).hType == set_compressed);
  local_f8 = 1;
  seqCount = 0;
  _writeSeqEntropy = 0;
  llCodePtr = (BYTE *)dst;
  oend = (BYTE *)dst;
  lend = ip;
  send = (seqDef *)lstart;
  sstart = (seqDef *)dst;
  dst_local = cctxParams;
  cctxParams_local = (ZSTD_CCtx_params *)entropyMetadata;
  entropyMetadata_local = (ZSTD_entropyCTablesMetadata_t *)nextCBlock;
  nextCBlock_local = prevCBlock;
  prevCBlock_local = (ZSTD_compressedBlockState_t *)seqStorePtr;
  do {
    sequence = (seqDef *)0x0;
    if (send == sp) {
      cBlockSizeEstimate._4_4_ = 1;
    }
    else {
      local_110 = (seqDef *)(lstart + _writeSeqEntropy * 8);
      cBlockSizeEstimate._4_4_ = (uint)(local_110 == sp + -1);
      _seqEntropyWritten = ZSTD_getSequenceLength((seqStore_t *)prevCBlock_local,local_110);
      seqCount = ((ulong)_seqEntropyWritten & 0xffffffff) + seqCount;
      _writeSeqEntropy = _writeSeqEntropy + 1;
    }
    if (cBlockSizeEstimate._4_4_ != 0) {
      seqCount = (long)lp - (long)ip;
    }
    sequence = (seqDef *)
               ZSTD_estimateSubBlockSize
                         (ip,seqCount,(BYTE *)targetCBlockSize,mlCodePtr,ofCodePtr,_writeSeqEntropy,
                          (ZSTD_entropyCTables_t *)entropyMetadata_local,
                          (ZSTD_entropyCTablesMetadata_t *)cctxParams_local,workspace,wkspSize,
                          lastSequence,local_f8);
    if ((litSize < sequence) || (cBlockSizeEstimate._4_4_ != 0)) {
      decompressedSize._4_4_ = 0;
      decompressedSize._0_4_ = 0;
      sVar3 = ZSTD_seqDecompressedSize
                        ((seqStore_t *)prevCBlock_local,(seqDef *)lstart,_writeSeqEntropy,seqCount,
                         cBlockSizeEstimate._4_4_);
      local_181 = lastBlock != 0 && cBlockSizeEstimate._4_4_ != 0;
      code = ZSTD_compressSubBlock
                       ((ZSTD_entropyCTables_t *)entropyMetadata_local,
                        (ZSTD_entropyCTablesMetadata_t *)cctxParams_local,(seqDef *)lstart,
                        _writeSeqEntropy,ip,seqCount,mlCodePtr,ofCodePtr,(BYTE *)targetCBlockSize,
                        (ZSTD_CCtx_params *)dst_local,llCodePtr,(long)op - (long)llCodePtr,bmi2,
                        lastSequence,local_f8,(int *)((long)&decompressedSize + 4),
                        (int *)&decompressedSize,(uint)local_181);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        return code;
      }
      if ((code != 0) && (code < sVar3)) {
        iend = iend + sVar3;
        lstart = lstart + _writeSeqEntropy * 8;
        ip = ip + seqCount;
        llCodePtr = llCodePtr + code;
        mlCodePtr = mlCodePtr + _writeSeqEntropy;
        ofCodePtr = ofCodePtr + _writeSeqEntropy;
        targetCBlockSize = _writeSeqEntropy + targetCBlockSize;
        seqCount = 0;
        _writeSeqEntropy = 0;
        if (decompressedSize._4_4_ != 0) {
          lastSequence = 0;
        }
        if ((int)decompressedSize != 0) {
          local_f8 = 0;
        }
      }
    }
  } while (cBlockSizeEstimate._4_4_ == 0);
  if (lastSequence != 0) {
    memcpy(entropyMetadata_local,nextCBlock_local,0x404);
  }
  if ((local_f8 == 0) ||
     (iVar2 = ZSTD_needSequenceEntropyTables
                        ((ZSTD_fseCTablesMetadata_t *)&cctxParams_local->useRowMatchFinder),
     iVar2 == 0)) {
    if (iend < ostart) {
      sVar3 = ZSTD_noCompressBlock
                        (llCodePtr,(long)op - (long)llCodePtr,iend,(long)ostart - (long)iend,
                         lastBlock);
      uVar1 = ERR_isError(sVar3);
      if (uVar1 != 0) {
        return sVar3;
      }
      llCodePtr = llCodePtr + sVar3;
      if (lstart < sp) {
        local_15c = *(undefined8 *)nextCBlock_local->rep;
        rep.rep[0] = nextCBlock_local->rep[2];
        for (rep.rep._4_8_ = send; (ulong)rep.rep._4_8_ < lstart; rep.rep._4_8_ = rep.rep._4_8_ + 8)
        {
          iVar2 = *(int *)rep.rep._4_8_;
          ZVar4 = ZSTD_getSequenceLength((seqStore_t *)prevCBlock_local,(seqDef *)rep.rep._4_8_);
          local_170 = ZVar4.litLength;
          rVar5 = ZSTD_updateRep((U32 *)&local_15c,iVar2 - 1,(uint)(local_170 == 0));
          local_180 = rVar5.rep._0_8_;
          local_178 = rVar5.rep[2];
          local_15c = local_180;
          rep.rep[0] = local_178;
        }
        *(undefined8 *)(entropyMetadata_local[0xe].fseMetadata.fseTablesBuffer + 0x38) = local_15c;
        *(U32 *)(entropyMetadata_local[0xe].fseMetadata.fseTablesBuffer + 0x40) = rep.rep[0];
      }
    }
    seqStorePtr_local = (seqStore_t *)(llCodePtr + -(long)oend);
  }
  else {
    seqStorePtr_local = (seqStore_t *)0x0;
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

static size_t ZSTD_compressSubBlock_multi(const seqStore_t* seqStorePtr,
                            const ZSTD_compressedBlockState_t* prevCBlock,
                            ZSTD_compressedBlockState_t* nextCBlock,
                            const ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                            const ZSTD_CCtx_params* cctxParams,
                                  void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize,
                            const int bmi2, U32 lastBlock,
                            void* workspace, size_t wkspSize)
{
    const seqDef* const sstart = seqStorePtr->sequencesStart;
    const seqDef* const send = seqStorePtr->sequences;
    const seqDef* sp = sstart;
    const BYTE* const lstart = seqStorePtr->litStart;
    const BYTE* const lend = seqStorePtr->lit;
    const BYTE* lp = lstart;
    BYTE const* ip = (BYTE const*)src;
    BYTE const* const iend = ip + srcSize;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstCapacity;
    BYTE* op = ostart;
    const BYTE* llCodePtr = seqStorePtr->llCode;
    const BYTE* mlCodePtr = seqStorePtr->mlCode;
    const BYTE* ofCodePtr = seqStorePtr->ofCode;
    size_t targetCBlockSize = cctxParams->targetCBlockSize;
    size_t litSize, seqCount;
    int writeLitEntropy = entropyMetadata->hufMetadata.hType == set_compressed;
    int writeSeqEntropy = 1;
    int lastSequence = 0;

    DEBUGLOG(5, "ZSTD_compressSubBlock_multi (litSize=%u, nbSeq=%u)",
                (unsigned)(lend-lp), (unsigned)(send-sstart));

    litSize = 0;
    seqCount = 0;
    do {
        size_t cBlockSizeEstimate = 0;
        if (sstart == send) {
            lastSequence = 1;
        } else {
            const seqDef* const sequence = sp + seqCount;
            lastSequence = sequence == send - 1;
            litSize += ZSTD_getSequenceLength(seqStorePtr, sequence).litLength;
            seqCount++;
        }
        if (lastSequence) {
            assert(lp <= lend);
            assert(litSize <= (size_t)(lend - lp));
            litSize = (size_t)(lend - lp);
        }
        /* I think there is an optimization opportunity here.
         * Calling ZSTD_estimateSubBlockSize for every sequence can be wasteful
         * since it recalculates estimate from scratch.
         * For example, it would recount literal distribution and symbol codes everytime.
         */
        cBlockSizeEstimate = ZSTD_estimateSubBlockSize(lp, litSize, ofCodePtr, llCodePtr, mlCodePtr, seqCount,
                                                       &nextCBlock->entropy, entropyMetadata,
                                                       workspace, wkspSize, writeLitEntropy, writeSeqEntropy);
        if (cBlockSizeEstimate > targetCBlockSize || lastSequence) {
            int litEntropyWritten = 0;
            int seqEntropyWritten = 0;
            const size_t decompressedSize = ZSTD_seqDecompressedSize(seqStorePtr, sp, seqCount, litSize, lastSequence);
            const size_t cSize = ZSTD_compressSubBlock(&nextCBlock->entropy, entropyMetadata,
                                                       sp, seqCount,
                                                       lp, litSize,
                                                       llCodePtr, mlCodePtr, ofCodePtr,
                                                       cctxParams,
                                                       op, oend-op,
                                                       bmi2, writeLitEntropy, writeSeqEntropy,
                                                       &litEntropyWritten, &seqEntropyWritten,
                                                       lastBlock && lastSequence);
            FORWARD_IF_ERROR(cSize, "ZSTD_compressSubBlock failed");
            if (cSize > 0 && cSize < decompressedSize) {
                DEBUGLOG(5, "Committed the sub-block");
                assert(ip + decompressedSize <= iend);
                ip += decompressedSize;
                sp += seqCount;
                lp += litSize;
                op += cSize;
                llCodePtr += seqCount;
                mlCodePtr += seqCount;
                ofCodePtr += seqCount;
                litSize = 0;
                seqCount = 0;
                /* Entropy only needs to be written once */
                if (litEntropyWritten) {
                    writeLitEntropy = 0;
                }
                if (seqEntropyWritten) {
                    writeSeqEntropy = 0;
                }
            }
        }
    } while (!lastSequence);
    if (writeLitEntropy) {
        DEBUGLOG(5, "ZSTD_compressSubBlock_multi has literal entropy tables unwritten");
        ZSTD_memcpy(&nextCBlock->entropy.huf, &prevCBlock->entropy.huf, sizeof(prevCBlock->entropy.huf));
    }
    if (writeSeqEntropy && ZSTD_needSequenceEntropyTables(&entropyMetadata->fseMetadata)) {
        /* If we haven't written our entropy tables, then we've violated our contract and
         * must emit an uncompressed block.
         */
        DEBUGLOG(5, "ZSTD_compressSubBlock_multi has sequence entropy tables unwritten");
        return 0;
    }
    if (ip < iend) {
        size_t const cSize = ZSTD_noCompressBlock(op, oend - op, ip, iend - ip, lastBlock);
        DEBUGLOG(5, "ZSTD_compressSubBlock_multi last sub-block uncompressed, %zu bytes", (size_t)(iend - ip));
        FORWARD_IF_ERROR(cSize, "ZSTD_noCompressBlock failed");
        assert(cSize != 0);
        op += cSize;
        /* We have to regenerate the repcodes because we've skipped some sequences */
        if (sp < send) {
            seqDef const* seq;
            repcodes_t rep;
            ZSTD_memcpy(&rep, prevCBlock->rep, sizeof(rep));
            for (seq = sstart; seq < sp; ++seq) {
                rep = ZSTD_updateRep(rep.rep, seq->offset - 1, ZSTD_getSequenceLength(seqStorePtr, seq).litLength == 0);
            }
            ZSTD_memcpy(nextCBlock->rep, &rep, sizeof(rep));
        }
    }
    DEBUGLOG(5, "ZSTD_compressSubBlock_multi compressed");
    return op-ostart;
}